

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

SymbolVisibility __thiscall google::protobuf::Symbol::GetEffectiveVisibility(Symbol *this)

{
  bool bVar1;
  FeatureSet_VisibilityFeature_DefaultSymbolVisibility FVar2;
  FeatureSet *this_00;
  LogMessage *pLVar3;
  LogMessage local_30;
  Voidify local_1d;
  SymbolVisibility local_1c;
  Symbol *pSStack_18;
  SymbolVisibility effective_visibility;
  Symbol *this_local;
  
  pSStack_18 = this;
  bVar1 = IsType(this);
  if (bVar1) {
    local_1c = visibility_keyword(this);
    this_local._4_4_ = local_1c;
    if (local_1c == VISIBILITY_UNSET) {
      this_00 = features(this);
      FVar2 = FeatureSet::default_symbol_visibility(this_00);
      switch(FVar2) {
      case FeatureSet_VisibilityFeature_DefaultSymbolVisibility_DEFAULT_SYMBOL_VISIBILITY_UNKNOWN:
      default:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x3a1,"false");
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      case FeatureSet_VisibilityFeature_DefaultSymbolVisibility_EXPORT_ALL:
        this_local._4_4_ = VISIBILITY_EXPORT;
        break;
      case FeatureSet_VisibilityFeature_DefaultSymbolVisibility_EXPORT_TOP_LEVEL:
        bVar1 = IsNestedDefinition(this);
        this_local._4_4_ = VISIBILITY_EXPORT;
        if (bVar1) {
          this_local._4_4_ = VISIBILITY_LOCAL;
        }
        break;
      case FeatureSet_VisibilityFeature_DefaultSymbolVisibility_LOCAL_ALL:
      case FeatureSet_VisibilityFeature_DefaultSymbolVisibility_STRICT:
        this_local._4_4_ = VISIBILITY_LOCAL;
      }
    }
  }
  else {
    this_local._4_4_ = VISIBILITY_UNSET;
  }
  return this_local._4_4_;
}

Assistant:

SymbolVisibility GetEffectiveVisibility() const {
    // Only Types have visibility
    if (!IsType()) {
      return SymbolVisibility::VISIBILITY_UNSET;
    }

    SymbolVisibility effective_visibility = visibility_keyword();

    // If our visibility is specifically set we can return that.  We'll validate
    // whether it's reasonable or not later.
    if (effective_visibility == SymbolVisibility::VISIBILITY_UNSET) {
      switch (features().default_symbol_visibility()) {
        case FeatureSet::VisibilityFeature::EXPORT_ALL:
          return SymbolVisibility::VISIBILITY_EXPORT;
        case FeatureSet::VisibilityFeature::EXPORT_TOP_LEVEL:
          return IsNestedDefinition() ? SymbolVisibility::VISIBILITY_LOCAL
                                      : SymbolVisibility::VISIBILITY_EXPORT;
        case FeatureSet::VisibilityFeature::LOCAL_ALL:
        case FeatureSet::VisibilityFeature::STRICT:
          return SymbolVisibility::VISIBILITY_LOCAL;

        // Unset shouldn't be possible from the compiler without there being an
        // error (recursive import, for example), but happens in unit
        // tests so assume it represents pre-edition 2024 defaults. In either
        // case we want to fail open.  We have a DCHECK here to make sure it can
        // fail in tests, but not released code.
        case FeatureSet::VisibilityFeature::DEFAULT_SYMBOL_VISIBILITY_UNKNOWN:
        default:
          ABSL_DCHECK(false);
          return SymbolVisibility::VISIBILITY_EXPORT;
      }
    }

    return effective_visibility;
  }